

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

Element __thiscall ftxui::MenuBase::Render(MenuBase *this)

{
  pointer *ppsVar1;
  int iVar2;
  MenuBase *pMVar3;
  bool bVar4;
  pointer psVar5;
  ComponentBase *pCVar6;
  ComponentBase **ppCVar7;
  long *plVar8;
  char *pcVar9;
  size_type *psVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  code *pcVar11;
  int iVar12;
  ComponentBase *in_RSI;
  Element EVar13;
  Elements elements;
  Decorator style;
  ulong local_190;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_188;
  code *local_170;
  ComponentBase *local_168;
  long local_160;
  string local_158;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  MenuBase *local_118;
  ComponentBase *local_110;
  string local_108;
  Element local_e8;
  Element local_d8;
  ftxui local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ftxui local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  Elements local_68;
  _Any_data local_50;
  code *local_40;
  
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = ComponentBase::Focused(in_RSI);
  local_168 = in_RSI + 7;
  psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
  if (psVar5 == (pointer)0x0) {
    psVar5 = in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)local_168,
             (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi -
             (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr >> 5);
  if (bVar4) {
    local_170 = focus;
  }
  else {
    local_170 = select;
  }
  local_110 = in_RSI + 1;
  ppsVar1 = &in_RSI[1].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_160 = 0;
  local_190 = 0;
  local_118 = this;
  while( true ) {
    pMVar3 = local_118;
    psVar5 = (pointer)in_RSI[1]._vptr_ComponentBase;
    if (psVar5 == (pointer)0x0) {
      psVar5 = in_RSI[1].children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if ((ulong)((long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_refcount._M_pi -
                (long)(psVar5->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr >> 5) <= local_190) break;
    pCVar6 = in_RSI[6].parent_;
    if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
      pCVar6 = (ComponentBase *)ppsVar1;
    }
    ppCVar7 = &pCVar6[4].parent_;
    if ((ComponentBase **)pCVar6[5]._vptr_ComponentBase != (ComponentBase **)0x0) {
      ppCVar7 = (ComponentBase **)pCVar6[5]._vptr_ComponentBase;
    }
    iVar12 = (int)local_190;
    iVar2 = *(int *)&((in_RSI[1].children_.
                       super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (iVar12 == iVar2) {
      if (iVar12 != *(int *)ppCVar7 || !bVar4) {
        pCVar6 = in_RSI[6].parent_;
        if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
          pCVar6 = (ComponentBase *)ppsVar1;
        }
        pCVar6 = (ComponentBase *)
                 &pCVar6[1].children_.
                  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        pCVar6 = in_RSI[6].parent_;
        if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
          pCVar6 = (ComponentBase *)ppsVar1;
        }
        pCVar6 = (ComponentBase *)
                 &pCVar6[2].children_.
                  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (iVar12 != *(int *)ppCVar7 || !bVar4) {
      pCVar6 = in_RSI[6].parent_;
      if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
        pCVar6 = (ComponentBase *)ppsVar1;
      }
    }
    else {
      pCVar6 = in_RSI[6].parent_;
      if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
        pCVar6 = (ComponentBase *)ppsVar1;
      }
      pCVar6 = (ComponentBase *)&pCVar6->parent_;
    }
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)pCVar6);
    pcVar11 = local_170;
    if (iVar12 != iVar2) {
      pcVar11 = nothing;
    }
    ConstStringListRef::operator[][abi_cxx11_(&local_108,(ConstStringListRef *)local_110,local_190);
    pcVar9 = "> ";
    if (iVar12 != iVar2) {
      pcVar9 = "  ";
    }
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)pcVar9);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158.field_2._8_8_ = plVar8[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar10;
      local_158._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_158._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    text((ftxui *)&local_e8,&local_158);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              ((function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_50,
               (function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)&local_a8);
    operator|(local_c8,&local_e8,(Decorator *)&local_50);
    local_138._8_8_ = 0;
    pcStack_120 = std::
                  _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_manager;
    local_138._M_unused._M_object = pcVar11;
    operator|((ftxui *)&local_d8,(Element *)local_c8,(Decorator *)&local_138);
    reflect((Box *)((long)&((((_Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_> *)
                             &local_168->_vptr_ComponentBase)->_M_impl).super__Vector_impl_data.
                           _M_start)->x_min + local_160));
    operator|(local_b8,&local_d8,(Decorator *)&local_88);
    std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
    emplace_back<std::shared_ptr<ftxui::Node>>
              ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>> *)
               &local_188,(shared_ptr<ftxui::Node> *)local_b8);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if (local_e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    local_190 = local_190 + 1;
    local_160 = local_160 + 0x10;
  }
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_188.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_188.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_188.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vbox((ftxui *)local_118,&local_68);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_68);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_188);
  EVar13.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar13.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pMVar3
  ;
  return (Element)EVar13.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() {
    Elements elements;
    bool is_menu_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      bool is_focused = (focused_entry() == int(i)) && is_menu_focused;
      bool is_selected = (*selected_ == int(i));

      auto style = is_selected ? (is_focused ? option_->style_selected_focused
                                             : option_->style_selected)
                               : (is_focused ? option_->style_focused
                                             : option_->style_normal);
      auto focus_management = !is_selected      ? nothing
                              : is_menu_focused ? focus
                                                : select;
      auto icon = is_selected ? "> " : "  ";
      elements.push_back(text(icon + entries_[i]) | style | focus_management |
                         reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }